

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
_evaluateResult<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *solver,Status result,bool usingRefinedLP,SolRational *sol,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *dualReal,bool *infeasible,bool *unbounded,bool *stoppedTime,bool *stoppedIter,bool *error
          )

{
  double dVar1;
  int iVar2;
  long lVar3;
  Verbosity old_verbosity;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  undefined8 uVar4;
  
  dVar1 = *(double *)(*(long *)(this + 0x20) + 0xb0);
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    uVar4 = (**(code **)(**(long **)(*(long *)(this + 0x20) + 8) + 0x30))();
    *(undefined8 *)(*(long *)(this + 0x20) + 0xb0) = uVar4;
  }
  lVar3 = *(long *)(this + 0x20);
  if (*(int *)(lVar3 + 200) == 0) {
    *(undefined4 *)(lVar3 + 200) = *(undefined4 *)(lVar3 + 0xb8);
  }
  switch(result) {
  case OPTIMAL:
    iVar2 = *(int *)(this + 0x10);
    if (2 < iVar2) {
      *(undefined4 *)(this + 0x10) = 3;
      std::__ostream_insert<char,std::char_traits<char>>
                (*(ostream **)(*(long *)(this + 0x18) + 0x18),"Floating-point optimal.\n",0x18);
      *(int *)(this + 0x10) = iVar2;
    }
    return false;
  case UNBOUNDED:
    iVar2 = *(int *)(this + 0x10);
    error = unbounded;
    if (2 < iVar2) {
      *(undefined4 *)(this + 0x10) = 3;
      std::__ostream_insert<char,std::char_traits<char>>
                (*(ostream **)(*(long *)(this + 0x18) + 0x18),"Floating-point unbounded.\n",0x1a);
      *(int *)(this + 0x10) = iVar2;
    }
    break;
  case INFEASIBLE:
    iVar2 = *(int *)(this + 0x10);
    if (2 < iVar2) {
      *(undefined4 *)(this + 0x10) = 3;
      std::__ostream_insert<char,std::char_traits<char>>
                (*(ostream **)(*(long *)(this + 0x18) + 0x18),"Floating-point infeasible.\n",0x1b);
      *(int *)(this + 0x10) = iVar2;
    }
    error = infeasible;
    if ((usingRefinedLP) ||
       (this[0x5e20] ==
        (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
         )0x1)) {
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                   *)&sol->_dualFarkas,dualReal);
      sol->field_0xd0 = sol->field_0xd0 | 8;
    }
    else {
      sol->field_0xd0 = sol->field_0xd0 & 0xf7;
    }
    break;
  case ABORT_TIME:
    *stoppedTime = true;
    return true;
  case ABORT_ITER:
    error = stoppedIter;
    break;
  default:
  }
  if (usingRefinedLP) {
    (*(solver->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x3e])(solver);
  }
  *error = true;
  return true;
}

Assistant:

bool SoPlexBase<R>::_evaluateResult(
   SPxSolverBase<T>& solver,
   typename SPxSolverBase<T>::Status result,
   bool usingRefinedLP,
   SolRational& sol,
   VectorBase<T>& dualReal,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error)
{
   // we always evaluate the result after a solve so the first time is a good place to
   // set the fp Time
   if(_statistics->fpTime == 0)
      _statistics->fpTime = _statistics->solvingTime->time();

   if(_statistics->iterationsFP == 0)
      _statistics->iterationsFP = _statistics->iterations;

   switch(result)
   {
   case SPxSolverBase<T>::OPTIMAL:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point optimal.\n");
      return false;

   case SPxSolverBase<T>::INFEASIBLE:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point infeasible.\n");

      // when not using refined LP
      // the floating-point solve returns a Farkas ray if and only if the simplifier was not used, which is exactly
      // the case when a basis could be returned
      if(usingRefinedLP || _hasBasis)
      {
         sol._dualFarkas = dualReal;
         sol._hasDualFarkas = true;
      }
      else
         sol._hasDualFarkas = false;

      if(usingRefinedLP)
         solver.clearRowObjs();

      infeasible = true;
      return true;

   case SPxSolverBase<T>::UNBOUNDED:
      SPX_MSG_INFO1(spxout, spxout << "Floating-point unbounded.\n");

      if(usingRefinedLP)
         solver.clearRowObjs();

      unbounded = true;
      return true;

   case SPxSolverBase<T>::ABORT_TIME:
      stoppedTime = true;
      return true;

   case SPxSolverBase<T>::ABORT_ITER:
      if(usingRefinedLP)
         solver.clearRowObjs();

      stoppedIter = true;
      return true;

   default:
      if(usingRefinedLP)
         solver.clearRowObjs();

      error = true;
      return true;
   }
}